

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O0

bool __thiscall
kj::Function<bool_(capnp::MessageBuilder_&)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1657:35)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1657:35)>
             *this,MessageBuilder *params)

{
  bool bVar1;
  MessageBuilder *builder;
  MessageBuilder *params_local;
  Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1657:35)>
  *this_local;
  
  builder = fwd<capnp::MessageBuilder&>(params);
  bVar1 = NoInfer_<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1657:35)>
          ::Type::operator()(&this->f,builder);
  return bVar1;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }